

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBuilderTests.cpp
# Opt level: O1

void __thiscall
agge::tests::LayoutBuilderTests::TrimmingSingleRangeRestoresExtentAndGlyphs
          (LayoutBuilderTests *this)

{
  text_lines_container_t *text_lines;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *pvVar1;
  long lVar2;
  positioned_glyph *ppVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector_r vVar7;
  iterator __position;
  real_t rVar8;
  FailedAssertion *pFVar9;
  ulong uVar10;
  vector_r vVar11;
  _Alloc_hider _Var12;
  float *pfVar13;
  uint uVar14;
  float fVar15;
  const_iterator i;
  state s2;
  state s1;
  layout_builder m;
  undefined1 local_3a8 [24];
  vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> avStack_390 [8];
  iterator local_388;
  positioned_glyph *ppStack_380;
  bool local_378;
  undefined1 local_370 [4];
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [16];
  pointer local_350;
  pointer ppStack_348;
  bool local_340;
  glyph_runs_container_t *local_338;
  undefined1 local_330 [4];
  float fStack_32c;
  float local_328;
  undefined4 uStack_324;
  undefined1 local_320 [16];
  undefined1 uStack_310;
  undefined7 uStack_30f;
  undefined1 local_308;
  undefined7 uStack_307;
  bool bStack_300;
  undefined1 local_2f8 [8];
  pointer prStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [2];
  ref_text_line local_2c8;
  ref_text_line local_2a0;
  string local_278;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_258;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_188;
  uint local_170 [2];
  LocationInfo local_168;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_140;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_128;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_110;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_f8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_e0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_c8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_b0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_98;
  state local_78;
  state local_70;
  layout_builder local_68;
  
  local_338 = &this->glyph_runs;
  text_lines = &this->text_lines;
  layout_builder::layout_builder(&local_68,&this->glyphs,local_338,text_lines);
  layout_builder::begin_style(&local_68,&this->font2);
  ppVar3 = (local_68._glyphs)->_begin;
  ppVar3[local_68._state.next].index = 0xb;
  ppVar3[local_68._state.next].d.dx = 3.0;
  ppVar3[local_68._state.next].d.dy = 0.0;
  uVar14 = local_68._state.next + 2;
  ppVar3[local_68._state.next + 1].index = 0xc;
  ppVar3[local_68._state.next + 1].d.dx = 5.3;
  ppVar3[local_68._state.next + 1].d.dy = 0.0;
  local_68._state.extent = local_68._state.extent + 3.0 + 5.3;
  local_70.next = uVar14;
  local_70.extent = local_68._state.extent;
  local_68._state.next = local_68._state.next + 3;
  ppVar3 = (local_68._glyphs)->_begin;
  ppVar3[uVar14].index = 0xd;
  ppVar3 = ppVar3 + uVar14;
  (ppVar3->d).dx = 3.1;
  (ppVar3->d).dy = 0.0;
  local_68._state.extent = local_68._state.extent + 3.1;
  layout_builder::trim_current_line(&local_68,&local_70);
  local_3a8._0_8_ = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0xb;
  local_2a0._offset.dx = 1.68156e-44;
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_1b8,
             (iterator)
             local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,(uint *)&local_2a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8,&local_1b8);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_388._M_current = (positioned_glyph *)0x0;
  ppStack_380 = (positioned_glyph *)0x0;
  local_3a8._16_4_ = 0.0;
  local_3a8._20_4_ = 0.0;
  avStack_390 = (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0;
  local_378 = false;
  local_3a8._8_8_ = p_Var4;
  if (local_2f8 != (undefined1  [8])prStack_2f0) {
    vVar11 = (vector_r)local_2f8;
    do {
      local_370 = *(undefined1 (*) [4])vVar11;
      fStack_36c = 0.0;
      fStack_368 = 0.0;
      if (local_388._M_current == ppStack_380) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  (avStack_390,local_388,(positioned_glyph *)local_370);
      }
      else {
        ((local_388._M_current)->d).dy = 0.0;
        (local_388._M_current)->index = (int)(ulong)(uint)local_370;
        ((local_388._M_current)->d).dx = (float)(int)((ulong)(uint)local_370 >> 0x20);
        local_388._M_current = local_388._M_current + 1;
      }
      vVar11 = (vector_r)((long)vVar11 + 4);
    } while (vVar11 != (vector_r)prStack_2f0);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2c8,1,(value_type *)local_3a8,(allocator_type *)local_370);
  _local_330 = (vector_r)local_320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_330,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_370,(string *)local_330,0x12f);
  ut::
  are_equal<std::vector<agge::tests::ref_glyph_run,std::allocator<agge::tests::ref_glyph_run>>,std::vector<agge::glyph_run,std::allocator<agge::glyph_run>>>
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2c8,local_338,(LocationInfo *)local_370);
  vVar11.dy = fStack_36c;
  vVar11.dx = (float)local_370;
  if (vVar11 != (vector_r)local_360) {
    operator_delete((void *)vVar11);
  }
  if (_local_330 != (vector_r)local_320) {
    operator_delete((void *)_local_330);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2c8);
  if (avStack_390 != (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0
     ) {
    operator_delete((void *)avStack_390);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
  }
  if ((vector_r)local_2f8 != (vector_r)0x0) {
    operator_delete((void *)local_2f8);
  }
  if (local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_2f8._0_4_ = 0.0;
  local_2f8._4_4_ = 0.0;
  prStack_2f0 = (pointer)0x0;
  local_2e8[0]._M_allocated_capacity = (pointer)0x0;
  ref_text_line::ref_text_line
            ((ref_text_line *)local_3a8,0.0,0.0,0.0,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2f8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2c8,1,(value_type *)local_3a8,(allocator_type *)local_370);
  _local_330 = (vector_r)local_320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_330,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_370,(string *)local_330,0x130);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2c8,text_lines,(LocationInfo *)local_370);
  vVar7.dy = fStack_36c;
  vVar7.dx = (float)local_370;
  if (vVar7 != (vector_r)local_360) {
    operator_delete((void *)vVar7);
  }
  if (_local_330 != (vector_r)local_320) {
    operator_delete((void *)_local_330);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2c8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             ((long)local_3a8 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2f8);
  rVar8 = local_68._state.extent;
  _local_330 = (vector_r)local_320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_330,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_3a8,(string *)local_330,0x131);
  fVar15 = 8.3 - rVar8;
  if (0.001 < ABS((fVar15 + fVar15) / (rVar8 + 8.3))) {
    pFVar9 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    _local_370 = (vector_r)local_360;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_370,"Values are not approximately equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar9,(string *)local_370,(LocationInfo *)local_3a8);
    __cxa_throw(pFVar9,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if (local_3a8._0_8_ != (long)local_3a8 + 0x10) {
    operator_delete((void *)local_3a8._0_8_);
  }
  if (_local_330 != (vector_r)local_320) {
    operator_delete((void *)_local_330);
  }
  layout_builder::break_current_line(&local_68);
  vVar11 = (vector_r)(this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Var4 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0xb;
  local_168.filename._M_dataplus._M_p._0_4_ = 0xc;
  local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_1d8,
             (iterator)
             local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,(uint *)&local_168);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a0,&local_1d8);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_388._M_current = (positioned_glyph *)0x0;
  ppStack_380 = (positioned_glyph *)0x0;
  local_3a8._16_4_ = 0.0;
  local_3a8._20_4_ = 0.0;
  avStack_390 = (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0;
  local_378 = false;
  pfVar13 = (float *)CONCAT44(local_2a0._offset.dy,local_2a0._offset.dx);
  local_3a8._0_8_ = vVar11;
  local_3a8._8_8_ = p_Var4;
  if (pfVar13 != (float *)CONCAT44(local_2a0._12_4_,local_2a0._extent)) {
    do {
      local_370 = (undefined1  [4])*pfVar13;
      fStack_36c = 0.0;
      fStack_368 = 0.0;
      if (local_388._M_current == ppStack_380) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  (avStack_390,local_388,(positioned_glyph *)local_370);
      }
      else {
        ((local_388._M_current)->d).dy = 0.0;
        (local_388._M_current)->index = (int)(ulong)(uint)local_370;
        ((local_388._M_current)->d).dx = (float)(int)((ulong)(uint)local_370 >> 0x20);
        local_388._M_current = local_388._M_current + 1;
      }
      pfVar13 = pfVar13 + 1;
    } while (pfVar13 != (float *)CONCAT44(local_2a0._12_4_,local_2a0._extent));
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_c8,1,(value_type *)local_3a8,(allocator_type *)local_370);
  peVar5 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_370 = SUB84(peVar5,0);
  fStack_36c = (float)((ulong)peVar5 >> 0x20);
  fStack_368 = SUB84(p_Var6,0);
  uStack_364 = (undefined4)((ulong)p_Var6 >> 0x20);
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_350 = (pointer)0x0;
  ppStack_348 = (pointer)0x0;
  local_360._0_8_ = 0;
  local_360._8_8_ = (void *)0x0;
  local_340 = false;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::push_back
            (&local_c8,(value_type *)local_370);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2f8,&local_c8);
  pvVar1 = &local_2c8._glyph_runs;
  local_2c8._offset = (vector_r)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_330,(string *)&local_2c8,0x13a);
  ut::
  are_equal<std::vector<agge::tests::ref_glyph_run,std::allocator<agge::tests::ref_glyph_run>>,std::vector<agge::glyph_run,std::allocator<agge::glyph_run>>>
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2f8,local_338,(LocationInfo *)local_330);
  if (_local_330 != (vector_r)local_320) {
    operator_delete((void *)_local_330);
  }
  if (local_2c8._offset != (vector_r)pvVar1) {
    operator_delete((void *)local_2c8._offset);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2f8);
  if ((void *)local_360._8_8_ != (void *)0x0) {
    operator_delete((void *)local_360._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_364,fStack_368) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_364,fStack_368));
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_c8);
  if (avStack_390 != (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0
     ) {
    operator_delete((void *)avStack_390);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
  }
  if ((void *)CONCAT44(local_2a0._offset.dy,local_2a0._offset.dx) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_2a0._offset.dy,local_2a0._offset.dx));
  }
  if (local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  vVar11 = (vector_r)(this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Var4 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0xb;
  local_128.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xc;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_1f8,
             (iterator)
             local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,(uint *)&local_128);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_278,&local_1f8);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_388._M_current = (positioned_glyph *)0x0;
  ppStack_380 = (positioned_glyph *)0x0;
  local_3a8._16_4_ = 0.0;
  local_3a8._20_4_ = 0.0;
  avStack_390 = (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0;
  local_378 = false;
  local_3a8._0_8_ = vVar11;
  local_3a8._8_8_ = p_Var4;
  if (local_278._M_dataplus._M_p != (pointer)local_278._M_string_length) {
    _Var12._M_p = local_278._M_dataplus._M_p;
    do {
      local_330 = *(undefined1 (*) [4])_Var12._M_p;
      fStack_32c = 0.0;
      local_328 = 0.0;
      if (local_388._M_current == ppStack_380) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  (avStack_390,local_388,(positioned_glyph *)local_330);
      }
      else {
        ((local_388._M_current)->d).dy = 0.0;
        (local_388._M_current)->index = (int)(ulong)(uint)local_330;
        ((local_388._M_current)->d).dx = (float)(int)((ulong)(uint)local_330 >> 0x20);
        local_388._M_current = local_388._M_current + 1;
      }
      _Var12._M_p = _Var12._M_p + 4;
    } while (_Var12._M_p != (pointer)local_278._M_string_length);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_168,1,(value_type *)local_3a8,(allocator_type *)local_330);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_370,0.0,11.0,8.3,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_168);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_e0,1,(value_type *)local_370,(allocator_type *)local_330);
  local_258.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ref_text_line::ref_text_line((ref_text_line *)local_330,0.0,19.3,0.0,&local_258);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_e0,(value_type *)local_330);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2a0,&local_e0);
  local_2f8 = (undefined1  [8])local_2e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_2c8,(string *)local_2f8,0x13f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2a0,text_lines,(LocationInfo *)&local_2c8);
  if (local_2c8._offset != (vector_r)pvVar1) {
    operator_delete((void *)local_2c8._offset);
  }
  if (local_2f8 != (undefined1  [8])local_2e8) {
    operator_delete((void *)local_2f8);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2a0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_320);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_258);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_e0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_360);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_168);
  if (avStack_390 != (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0
     ) {
    operator_delete((void *)avStack_390);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
  }
  if ((uint *)local_278._M_dataplus._M_p != (uint *)0x0) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  uVar10 = (ulong)local_68._state.next;
  local_68._state.next = local_68._state.next + 1;
  ppVar3 = (local_68._glyphs)->_begin;
  ppVar3[uVar10].index = 0xe;
  ppVar3 = ppVar3 + uVar10;
  (ppVar3->d).dx = 5.7;
  (ppVar3->d).dy = 0.0;
  local_68._state.extent = local_68._state.extent + 5.7;
  layout_builder::begin_style(&local_68,&this->font1);
  ppVar3 = (local_68._glyphs)->_begin;
  ppVar3[local_68._state.next].index = 0xf;
  ppVar3[local_68._state.next].d.dx = 3.2;
  ppVar3[local_68._state.next].d.dy = 0.0;
  uVar14 = local_68._state.next + 2;
  ppVar3[local_68._state.next + 1].index = 0x10;
  ppVar3[local_68._state.next + 1].d.dx = 2.9;
  ppVar3[local_68._state.next + 1].d.dy = 0.0;
  local_68._state.extent = local_68._state.extent + 3.2 + 2.9;
  local_78.next = uVar14;
  local_78.extent = local_68._state.extent;
  local_68._state.next = local_68._state.next + 3;
  ppVar3 = (local_68._glyphs)->_begin;
  ppVar3[uVar14].index = 0x11;
  ppVar3 = ppVar3 + uVar14;
  (ppVar3->d).dx = 3.6;
  (ppVar3->d).dy = 0.0;
  local_68._state.extent = local_68._state.extent + 3.6;
  layout_builder::trim_current_line(&local_68,&local_78);
  local_338 = (glyph_runs_container_t *)CONCAT44(local_338._4_4_,local_68._state.extent);
  _local_330 = (vector_r)local_320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_330,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_3a8,(string *)local_330,0x14d);
  if (0.001 < ABS(((11.8 - local_338._0_4_) + (11.8 - local_338._0_4_)) / (local_338._0_4_ + 11.8)))
  {
    pFVar9 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    _local_370 = (vector_r)local_360;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_370,"Values are not approximately equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar9,(string *)local_370,(LocationInfo *)local_3a8);
    __cxa_throw(pFVar9,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if (local_3a8._0_8_ != (long)local_3a8 + 0x10) {
    operator_delete((void *)local_3a8._0_8_);
  }
  if (_local_330 != (vector_r)local_320) {
    operator_delete((void *)_local_330);
  }
  layout_builder::break_current_line(&local_68);
  vVar11 = (vector_r)(this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Var4 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0xb;
  local_170[1] = 0xc;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_218,
             (iterator)
             local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,local_170 + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_188,&local_218);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_388._M_current = (positioned_glyph *)0x0;
  ppStack_380 = (positioned_glyph *)0x0;
  local_3a8._16_4_ = 0.0;
  local_3a8._20_4_ = 0.0;
  avStack_390 = (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0;
  local_378 = false;
  local_3a8._0_8_ = vVar11;
  local_3a8._8_8_ = p_Var4;
  if (local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pfVar13 = (float *)local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    do {
      local_370 = (undefined1  [4])*pfVar13;
      fStack_36c = 0.0;
      fStack_368 = 0.0;
      if (local_388._M_current == ppStack_380) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  (avStack_390,local_388,(positioned_glyph *)local_370);
      }
      else {
        ((local_388._M_current)->d).dy = 0.0;
        (local_388._M_current)->index = (int)(ulong)(uint)local_370;
        ((local_388._M_current)->d).dx = (float)(int)((ulong)(uint)local_370 >> 0x20);
        local_388._M_current = local_388._M_current + 1;
      }
      pfVar13 = pfVar13 + 1;
    } while (pfVar13 !=
             (float *)local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_128,1,(value_type *)local_3a8,(allocator_type *)local_370);
  ref_text_line::ref_text_line(&local_2c8,0.0,11.0,8.3,&local_128);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_110,1,&local_2c8,(allocator_type *)local_370);
  peVar5 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_338 = (glyph_runs_container_t *)operator_new(4);
  *(float *)local_338 = 1.96182e-44;
  local_370 = SUB84(peVar5,0);
  fStack_36c = (float)((ulong)peVar5 >> 0x20);
  fStack_368 = SUB84(p_Var6,0);
  uStack_364 = (undefined4)((ulong)p_Var6 >> 0x20);
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_350 = (pointer)0x0;
  ppStack_348 = (pointer)0x0;
  local_360._0_8_ = 0;
  local_360._8_8_ = (void *)0x0;
  local_340 = false;
  local_330 = *(undefined1 (*) [4])local_338;
  fStack_32c = 0.0;
  local_328 = 0.0;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  _M_realloc_insert<agge::positioned_glyph_const&>
            ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
             (local_360 + 8),(iterator)0x0,(positioned_glyph *)local_330);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_140,1,(value_type *)local_370,(allocator_type *)local_330);
  peVar5 = (this->font1).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->font1).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0xf;
  local_170[0] = 0x10;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_238,
             (iterator)
             local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,local_170);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1a0,&local_238);
  local_330 = SUB84(peVar5,0);
  fStack_32c = (float)((ulong)peVar5 >> 0x20);
  local_328 = SUB84(this_00,0);
  uStack_324 = (undefined4)((ulong)this_00 >> 0x20);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_320._0_8_ = 0x40b66666;
  local_320._8_8_ = (void *)0x0;
  uStack_310 = 0;
  uStack_30f = 0;
  local_308 = 0;
  uStack_307 = 0;
  bStack_300 = false;
  if (local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pfVar13 = (float *)local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    do {
      local_2a0._offset.dx = *pfVar13;
      local_2a0._offset.dy = 0.0;
      local_2a0._extent = 0.0;
      __position._M_current._1_7_ = uStack_30f;
      __position._M_current._0_1_ = uStack_310;
      if (__position._M_current == (positioned_glyph *)CONCAT71(uStack_307,local_308)) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_320 + 8),__position,(positioned_glyph *)&local_2a0);
      }
      else {
        ((__position._M_current)->d).dy = 0.0;
        (__position._M_current)->index = (int)(ulong)(uint)local_2a0._offset.dx;
        ((__position._M_current)->d).dx = (float)(int)((ulong)(uint)local_2a0._offset.dx >> 0x20);
        lVar2 = CONCAT71(uStack_30f,uStack_310) + 0xc;
        uStack_310 = (undefined1)lVar2;
        uStack_30f = (undefined7)((ulong)lVar2 >> 8);
      }
      pfVar13 = pfVar13 + 1;
    } while (pfVar13 !=
             (float *)local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::push_back
            (&local_140,(value_type *)local_330);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_b0,&local_140);
  ref_text_line::ref_text_line((ref_text_line *)local_2f8,0.0,30.3,11.8,&local_b0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_110,(value_type *)local_2f8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_f8,&local_110);
  local_98.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ref_text_line::ref_text_line(&local_2a0,0.0,38.6,0.0,&local_98);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_f8,&local_2a0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_258,&local_f8);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_168,&local_278,0x15a);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_258,text_lines,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_168.filename._M_dataplus._M_p._4_4_,
                  local_168.filename._M_dataplus._M_p._0_4_) != &local_168.filename.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_168.filename._M_dataplus._M_p._4_4_,
                             local_168.filename._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_258);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2a0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_98);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_f8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2e8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_b0);
  if ((void *)local_320._8_8_ != (void *)0x0) {
    operator_delete((void *)local_320._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_324,local_328) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_324,local_328));
  }
  if ((float *)local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start != (float *)0x0) {
    operator_delete(local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_140);
  if ((void *)local_360._8_8_ != (void *)0x0) {
    operator_delete((void *)local_360._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_364,fStack_368) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_364,fStack_368));
  }
  operator_delete(local_338);
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_110);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2c8._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_128);
  if (avStack_390 != (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0
     ) {
    operator_delete((void *)avStack_390);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
  }
  if ((float *)local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start != (float *)0x0) {
    operator_delete(local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  return;
}

Assistant:

test( TrimmingSingleRangeRestoresExtentAndGlyphs )
			{
				// INIT
				layout_builder m(glyphs, glyph_runs, text_lines);

				m.begin_style(font2);
				m.append_glyph(11, 3.0f);
				m.append_glyph(12, 5.3f);
				layout_builder::state s1 = m.get_state();
				m.append_glyph(13, 3.1f);

				// ACT
				m.trim_current_line(s1);

				// ASSERT
				assert_equal(plural + ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u), glyph_runs);
				assert_equal(plural + ref_text_line(0.0f, 0.0f, 0.0f, vector<ref_glyph_run>()), text_lines);
				assert_approx_equal(8.3f, m.get_state().extent, 0.001);

				// ACT
				m.break_current_line();

				// ASSERT
				assert_equal(plural
					+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u)
					+ ref_glyph_run(font2, 0.0f, 0.0f, vector<glyph_index_t>()),
					glyph_runs);
				assert_equal(plural
					+ ref_text_line(0.0f, 11.0f, 8.3f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u))
					+ ref_text_line(0.0f, 19.3f, 0.0f, vector<ref_glyph_run>()),
					text_lines);

				// INIT
				m.append_glyph(14, 5.7f);
				m.begin_style(font1);
				m.append_glyph(15, 3.2f);
				m.append_glyph(16, 2.9f);
				layout_builder::state s2 = m.get_state();
				m.append_glyph(17, 3.6f);

				// ACT
				m.trim_current_line(s2);

				//ASSERT
				assert_approx_equal(11.8f, m.get_state().extent, 0.001);

				// ACT
				m.break_current_line();

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 11.0f, 8.3f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u))
					+ ref_text_line(0.0f, 30.3f, 11.8f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 14u)
						+ ref_glyph_run(font1, 5.7f, 0.0f, plural + 15u + 16u))
					+ ref_text_line(0.0f, 38.6f, 0.0f, vector<ref_glyph_run>()),
					text_lines);
			}